

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

void __thiscall FC_BPNN::FC_BPNN(FC_BPNN *this,int perceptronNum,...)

{
  long lVar1;
  char in_AL;
  uint *puVar2;
  Preceptron *this_00;
  mapped_type *ppPVar3;
  undefined8 in_RCX;
  ulong uVar4;
  ulong uVar5;
  undefined8 in_RDX;
  uint uVar6;
  long lVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  pointer pvVar8;
  int k;
  ulong uVar9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator_type local_181;
  FC_BPNN *local_180;
  va_list ap;
  size_t finder0;
  undefined8 local_138;
  vector<double,_std::allocator<double>_> layer_value;
  vector<double,_std::allocator<double>_> layer_loss;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  ap[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  uVar6 = (uint)local_d8;
  local_180 = this;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while (-1 < (int)uVar6) {
    layer_loss.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &layer_value.super__Vector_base<double,_std::allocator<double>_>,(ulong)uVar6,
               (value_type *)&layer_loss.super__Vector_base<double,_std::allocator<double>_>,
               (allocator_type *)&local_138);
    local_138 = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &layer_loss.super__Vector_base<double,_std::allocator<double>_>,(ulong)uVar6,
               (value_type *)&local_138,&local_181);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&local_180->layers_value,
                (value_type *)&layer_value.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->layers_error,
                (value_type *)&layer_loss.super__Vector_base<double,_std::allocator<double>_>);
    uVar5 = ap[0]._0_8_ & 0xffffffff;
    if (uVar5 < 0x29) {
      ap[0].gp_offset = ap[0].gp_offset + 8;
      puVar2 = (uint *)(uVar5 + (long)ap[0].reg_save_area);
    }
    else {
      puVar2 = (uint *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    uVar6 = *puVar2;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&layer_loss.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&layer_value.super__Vector_base<double,_std::allocator<double>_>);
  }
  for (uVar5 = 1;
      pvVar8 = (local_180->layers_value).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(local_180->layers_value).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0x18);
      uVar5 = uVar5 + 1) {
    layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar1 = uVar5 - 1;
    lVar7 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)pvVar8[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        *(long *)&pvVar8[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl >> 3); uVar4 = uVar4 + 1) {
      for (uVar9 = 0;
          uVar9 < (ulong)((long)pvVar8[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          *(long *)&pvVar8[uVar5].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl >> 3
                         ); uVar9 = uVar9 + 1) {
        layer_loss.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(lVar7 + uVar9);
        this_00 = (Preceptron *)operator_new(0x98);
        memset(this_00,0,0x98);
        this_00->_vptr_Preceptron = (_func_int **)&PTR_Construct_00107d30;
        Preceptron::Construct
                  (this_00,(int)((ulong)((long)pvVar8[lVar1].
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        *(long *)&pvVar8[lVar1].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl) >> 3));
        ppPVar3 = std::
                  map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                  ::operator[]((map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                                *)&layer_value,(key_type *)&layer_loss);
        *ppPVar3 = this_00;
        pvVar8 = (local_180->layers_value).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar7 = lVar7 + 0x100000000;
    }
    std::
    vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
    ::push_back(&this->net,(value_type *)&layer_value);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Preceptron_*>,_std::_Select1st<std::pair<const_unsigned_long,_Preceptron_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Preceptron_*>,_std::_Select1st<std::pair<const_unsigned_long,_Preceptron_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                 *)&layer_value);
  }
  return;
}

Assistant:

FC_BPNN::FC_BPNN(int perceptronNum, ...)
{
	va_list ap;
	va_start(ap, 0);
	int num = va_arg(ap, int);
	while (num > -1)
	{
		std::vector<double> layer_value(num, 0.0);
		std::vector<double> layer_loss(num, 0.0);
		layers_value.push_back(layer_value);
		layers_error.push_back(layer_loss);
		num = va_arg(ap, int);
	}
	va_end(ap);

	for (int i = 1; i < layers_value.size(); i++) {
		std::map<size_t, Preceptron*> subNet;
		for (int j = 0; j < layers_value[i - 1].size(); j++) {
			for (int k = 0; k < layers_value[i].size(); k++) {
				size_t finder0 = j;
				size_t finder1 = k;
				size_t finder = (finder0 << 32) | finder1;
				auto ptr = dynamic_cast<Preceptron*>(new Preceptron_SIGMOID());
				ptr->Construct(layers_value[i - 1].size());
				subNet[finder] = ptr;
			}
		}
		net.push_back(subNet);
	}

}